

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

string * __thiscall
Catch::TextFlow::Columns::iterator::operator*[abi_cxx11_
          (string *__return_storage_ptr__,iterator *this)

{
  pointer pCVar1;
  ulong uVar2;
  pointer piVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  string padding;
  string col;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  lVar4 = 0;
  padding._M_dataplus._M_p = (pointer)&padding.field_2;
  padding._M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  padding.field_2._M_local_buf[0] = '\0';
  lVar5 = 0;
  uVar6 = 0;
  while( true ) {
    pCVar1 = (this->m_columns->
             super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->m_columns->
                       super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1) / 0x38) <= uVar6)
    break;
    uVar2 = *(ulong *)((long)&pCVar1->m_width + lVar4);
    piVar3 = (this->m_iterators).
             super__Vector_base<Catch::TextFlow::Column::iterator,_std::allocator<Catch::TextFlow::Column::iterator>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((*(long *)((long)&piVar3->m_pos + lVar5) ==
         *(long *)((long)&(pCVar1->m_string)._M_string_length + lVar4)) &&
       ((long)&(pCVar1->m_string)._M_dataplus + lVar4 == *(long *)((long)&piVar3->m_column + lVar5))
       ) {
      std::__cxx11::string::append((ulong)&padding,(char)uVar2);
    }
    else {
      Column::iterator::operator*[abi_cxx11_(&col,(iterator *)((long)&piVar3->m_column + lVar5));
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      padding._M_string_length = 0;
      *padding._M_dataplus._M_p = '\0';
      if (col._M_string_length <= uVar2 && uVar2 - col._M_string_length != 0) {
        std::__cxx11::string::append((ulong)&padding,(char)(uVar2 - col._M_string_length));
      }
      std::__cxx11::string::~string((string *)&col);
    }
    uVar6 = uVar6 + 1;
    lVar5 = lVar5 + 0x28;
    lVar4 = lVar4 + 0x38;
  }
  std::__cxx11::string::~string((string *)&padding);
  return __return_storage_ptr__;
}

Assistant:

std::string Columns::iterator::operator*() const {
            std::string row, padding;

            for (size_t i = 0; i < m_columns.size(); ++i) {
                const auto width = m_columns[i].width();
                if (m_iterators[i] != m_columns[i].end()) {
                    std::string col = *m_iterators[i];
                    row += padding;
                    row += col;

                    padding.clear();
                    if (col.size() < width) {
                        padding.append(width - col.size(), ' ');
                    }
                }
                else {
                    padding.append(width, ' ');
                }
            }
            return row;
        }